

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

int mpc_nodecount_unretained(mpc_parser_t *p,int force)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  mpc_parser_t *p_00;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  iVar6 = 0;
  iVar2 = 1;
LAB_001b2f13:
  bVar7 = force != 0;
LAB_001b2f18:
  if ((!bVar7) && (p->retained != '\0')) {
    iVar2 = 0;
    goto switchD_001b2f38_caseD_6;
  }
  switch(p->type) {
  case '\x05':
    goto switchD_001b2f38_caseD_5;
  default:
    break;
  case '\x0f':
    goto switchD_001b2f38_caseD_f;
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x19':
  case '\x1a':
    p_00 = (p->data).expect.x;
    goto LAB_001b2f5a;
  case '\x14':
  case '\x15':
  case '\x16':
    p_00 = (p->data).repeat.x;
LAB_001b2f5a:
    iVar2 = mpc_nodecount_unretained(p_00,0);
    return iVar2 + iVar6 + 1;
  case '\x17':
    uVar1 = (p->data).repeat.n;
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    iVar2 = 1;
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      iVar3 = mpc_nodecount_unretained(*(mpc_parser_t **)((long)(p->data).lift.x + uVar5 * 8),0);
      iVar2 = iVar2 + iVar3;
    }
    break;
  case '\x18':
    uVar1 = (p->data).repeat.n;
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    iVar2 = 1;
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      iVar3 = mpc_nodecount_unretained(*(mpc_parser_t **)((long)(p->data).apply_to.d + uVar5 * 8),0)
      ;
      iVar2 = iVar2 + iVar3;
    }
  }
switchD_001b2f38_caseD_6:
  return iVar2 + iVar6;
switchD_001b2f38_caseD_f:
  p = (p->data).expect.x;
  iVar6 = iVar6 + 1;
  force = 0;
  goto LAB_001b2f13;
switchD_001b2f38_caseD_5:
  p = (p->data).expect.x;
  iVar6 = iVar6 + 1;
  bVar7 = false;
  goto LAB_001b2f18;
}

Assistant:

static int mpc_nodecount_unretained(mpc_parser_t* p, int force) {

  int i, total;

  if (p->retained && !force) { return 0; }

  if (p->type == MPC_TYPE_EXPECT) { return 1 + mpc_nodecount_unretained(p->data.expect.x, 0); }

  if (p->type == MPC_TYPE_APPLY)    { return 1 + mpc_nodecount_unretained(p->data.apply.x, 0); }
  if (p->type == MPC_TYPE_APPLY_TO) { return 1 + mpc_nodecount_unretained(p->data.apply_to.x, 0); }
  if (p->type == MPC_TYPE_PREDICT)  { return 1 + mpc_nodecount_unretained(p->data.predict.x, 0); }

  if (p->type == MPC_TYPE_CHECK)    { return 1 + mpc_nodecount_unretained(p->data.check.x, 0); }
  if (p->type == MPC_TYPE_CHECK_WITH) { return 1 + mpc_nodecount_unretained(p->data.check_with.x, 0); }

  if (p->type == MPC_TYPE_NOT)   { return 1 + mpc_nodecount_unretained(p->data.not.x, 0); }
  if (p->type == MPC_TYPE_MAYBE) { return 1 + mpc_nodecount_unretained(p->data.not.x, 0); }

  if (p->type == MPC_TYPE_MANY)  { return 1 + mpc_nodecount_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_MANY1) { return 1 + mpc_nodecount_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_COUNT) { return 1 + mpc_nodecount_unretained(p->data.repeat.x, 0); }

  if (p->type == MPC_TYPE_OR) {
    total = 1;
    for(i = 0; i < p->data.or.n; i++) {
      total += mpc_nodecount_unretained(p->data.or.xs[i], 0);
    }
    return total;
  }

  if (p->type == MPC_TYPE_AND) {
    total = 1;
    for(i = 0; i < p->data.and.n; i++) {
      total += mpc_nodecount_unretained(p->data.and.xs[i], 0);
    }
    return total;
  }

  return 1;

}